

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Float __thiscall pbrt::FloatBilerpTexture::Evaluate(FloatBilerpTexture *this,TextureEvalContext ctx)

{
  undefined1 auVar1 [16];
  anon_class_24_3_48d30edf func;
  float fVar2;
  undefined1 auVar3 [64];
  float fVar4;
  Tuple2<pbrt::Vector2,_float> local_68;
  undefined8 local_60;
  Vector2f *local_58;
  undefined8 *local_50;
  Tuple3<pbrt::Point3,_float> local_48 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_30 [3];
  int iStack_c;
  undefined1 extraout_var [56];
  
  local_50 = &local_60;
  local_58 = (Vector2f *)&local_68;
  local_60 = 0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_48[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_48[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_48[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_30[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_30[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_30[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_30[1].z = ctx.dudx;
  aTStack_30[2].x = ctx.dudy;
  aTStack_30[2].y = ctx.dvdx;
  aTStack_30[2].z = ctx.dvdy;
  iStack_c = ctx.faceIndex;
  func.dstdx = (Vector2f **)&local_50;
  func.ctx = (TextureEvalContext *)local_48;
  func.dstdy = &local_58;
  auVar3._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar3._8_56_ = extraout_var;
  auVar1 = vmovshdup_avx(auVar3._0_16_);
  fVar2 = auVar3._0_4_;
  fVar4 = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (1.0 - fVar4) * this->v10)),
                           ZEXT416((uint)((1.0 - fVar2) * (1.0 - fVar4))),ZEXT416((uint)this->v00));
  auVar1 = vfmadd132ss_fma(ZEXT416((uint)(fVar4 * (1.0 - fVar2))),auVar1,ZEXT416((uint)this->v01));
  auVar1 = vfmadd132ss_fma(ZEXT416((uint)(fVar2 * fVar4)),auVar1,ZEXT416((uint)this->v11));
  return auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00, v10, v01, v11});
    }